

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O0

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitArrayCopy
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,ArrayCopy *curr,
          optional<wasm::HeapType> dest,optional<wasm::HeapType> src)

{
  bool bVar1;
  Expression **ppEVar2;
  HeapType *pHVar3;
  Type local_80;
  Type local_78;
  uintptr_t local_70;
  Type local_68;
  Type local_60;
  uintptr_t local_58;
  Type local_50;
  HeapType local_48;
  HeapType local_40;
  ArrayCopy *local_38;
  ArrayCopy *curr_local;
  ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this_local;
  optional<wasm::HeapType> src_local;
  optional<wasm::HeapType> dest_local;
  
  this_local = src.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType>._M_payload;
  src_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ =
       dest.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_payload;
  src_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._0_1_ =
       src.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::HeapType>._M_engaged;
  local_38 = curr;
  curr_local = (ArrayCopy *)this;
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional *)
                     &src_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::HeapType>._M_engaged);
  if (!bVar1) {
    local_40 = wasm::Type::getHeapType(&local_38->destRef->type);
    std::optional<wasm::HeapType>::operator=
              ((optional<wasm::HeapType> *)
               &src_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._M_engaged,&local_40);
  }
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this_local);
  if (!bVar1) {
    local_48 = wasm::Type::getHeapType(&local_38->srcRef->type);
    std::optional<wasm::HeapType>::operator=((optional<wasm::HeapType> *)&this_local,&local_48);
  }
  ppEVar2 = &local_38->destRef;
  pHVar3 = std::optional<wasm::HeapType>::operator*
                     ((optional<wasm::HeapType> *)
                      &src_local.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::HeapType>._M_engaged);
  local_58 = pHVar3->id;
  wasm::Type::Type(&local_50,(HeapType)local_58,Nullable,Inexact);
  note(this,ppEVar2,local_50);
  ppEVar2 = &local_38->destIndex;
  wasm::Type::Type(&local_60,i32);
  note(this,ppEVar2,local_60);
  ppEVar2 = &local_38->srcRef;
  pHVar3 = std::optional<wasm::HeapType>::operator*((optional<wasm::HeapType> *)&this_local);
  local_70 = pHVar3->id;
  wasm::Type::Type(&local_68,(HeapType)local_70,Nullable,Inexact);
  note(this,ppEVar2,local_68);
  ppEVar2 = &local_38->srcIndex;
  wasm::Type::Type(&local_78,i32);
  note(this,ppEVar2,local_78);
  ppEVar2 = &local_38->length;
  wasm::Type::Type(&local_80,i32);
  note(this,ppEVar2,local_80);
  return;
}

Assistant:

void visitArrayCopy(ArrayCopy* curr,
                      std::optional<HeapType> dest = std::nullopt,
                      std::optional<HeapType> src = std::nullopt) {
    if (!dest) {
      dest = curr->destRef->type.getHeapType();
    }
    if (!src) {
      src = curr->srcRef->type.getHeapType();
    }
    note(&curr->destRef, Type(*dest, Nullable));
    note(&curr->destIndex, Type::i32);
    note(&curr->srcRef, Type(*src, Nullable));
    note(&curr->srcIndex, Type::i32);
    note(&curr->length, Type::i32);
  }